

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatchkit.hpp
# Opt level: O0

bool __thiscall
chaiscript::detail::Dispatch_Engine::is_type
          (Dispatch_Engine *this,Boxed_Value *r,string_view user_typename)

{
  basic_string_view<char,_std::char_traits<char>_> __x;
  Dispatch_Engine *pDVar1;
  size_t sVar2;
  bool bVar3;
  Type_Info *ti;
  Dynamic_Object *this_00;
  string *this_01;
  __sv_type __y;
  bad_cast *anon_var_0_1;
  Dynamic_Object *d;
  range_error *anon_var_0;
  Type_Info local_48;
  Boxed_Value *local_30;
  Boxed_Value *r_local;
  Dispatch_Engine *this_local;
  string_view user_typename_local;
  
  user_typename_local._M_len = (size_t)user_typename._M_str;
  this_local = (Dispatch_Engine *)user_typename._M_len;
  local_30 = r;
  r_local = (Boxed_Value *)this;
  get_type(&local_48,this,user_typename,true);
  ti = Boxed_Value::get_type_info(local_30);
  bVar3 = Type_Info::bare_equal(&local_48,ti);
  if (bVar3) {
    user_typename_local._M_str._7_1_ = true;
  }
  else {
    this_00 = boxed_cast<chaiscript::dispatch::Dynamic_Object_const&>(this,local_30);
    sVar2 = user_typename_local._M_len;
    pDVar1 = this_local;
    this_01 = dispatch::Dynamic_Object::get_type_name_abi_cxx11_(this_00);
    __y = std::__cxx11::string::operator_cast_to_basic_string_view((string *)this_01);
    __x._M_str = (char *)sVar2;
    __x._M_len = (size_t)pDVar1;
    user_typename_local._M_str._7_1_ = std::operator==(__x,__y);
  }
  return user_typename_local._M_str._7_1_;
}

Assistant:

bool is_type(const Boxed_Value &r, std::string_view user_typename) const noexcept {
        try {
          if (get_type(user_typename).bare_equal(r.get_type_info())) {
            return true;
          }
        } catch (const std::range_error &) {
        }

        try {
          const dispatch::Dynamic_Object &d = boxed_cast<const dispatch::Dynamic_Object &>(r);
          return d.get_type_name() == user_typename;
        } catch (const std::bad_cast &) {
        }

        return false;
      }